

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::numberOfParameter(argParserAdvancedConfiguration *this,int number)

{
  reference ppsVar1;
  reference ppaVar2;
  int number_local;
  argParserAdvancedConfiguration *this_local;
  
  ppsVar1 = std::
            vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            ::back(this->newargconfig);
  ppaVar2 = std::
            vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
            ::back((*ppsVar1)->arguments);
  (*ppaVar2)->numberOfArguments = number;
  return this;
}

Assistant:

argParserAdvancedConfiguration *argParserAdvancedConfiguration::numberOfParameter(int number) {
    newargconfig->back()->arguments->back()->numberOfArguments = number;

    return this;
}